

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O2

void __thiscall Clasp::BasicSatConfig::BasicSatConfig(BasicSatConfig *this)

{
  undefined1 local_90 [16];
  OptParams local_80;
  undefined8 local_7c;
  
  (this->super_ContextParams).satPre = (SatPreParams)0xfa000000000;
  *(undefined2 *)&(this->super_ContextParams).field_0x8 = 0x44;
  (this->super_UserConfiguration).super_Configuration._vptr_Configuration =
       (_func_int **)&PTR__BasicSatConfig_001e9d48;
  (this->solver_).ebo_.buf = (pointer)0x0;
  (this->solver_).ebo_.size = 0;
  (this->solver_).ebo_.cap = 0;
  (this->search_).ebo_.buf = (pointer)0x0;
  (this->search_).ebo_.size = 0;
  (this->search_).ebo_.cap = 0;
  (this->heu_).ptr_ = 0;
  local_90._0_8_ = (SolverStrategies)0x0;
  local_90._8_8_ = (HeuParams)0x100000;
  local_80 = (OptParams)0x0;
  local_7c._0_4_ = 1;
  local_7c._4_4_ = 0;
  bk_lib::pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_>::push_back
            (&this->solver_,(SolverParams *)local_90);
  SolveParams::SolveParams((SolveParams *)local_90);
  bk_lib::pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_>::push_back
            (&this->search_,(SolveParams *)local_90);
  return;
}

Assistant:

BasicSatConfig::BasicSatConfig() {
	solver_.push_back(SolverParams());
	search_.push_back(SolveParams());
}